

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

void Wln_ObjUpdateType(Wln_Ntk_t *p,int iObj,int Type)

{
  Vec_Int_t *p_00;
  int iVar1;
  
  p_00 = &p->vTypes;
  iVar1 = Vec_IntEntry(p_00,iObj);
  if (iVar1 != 0) {
    __assert_fail("Wln_ObjIsNone(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                  ,0x3c,"void Wln_ObjUpdateType(Wln_Ntk_t *, int, int)");
  }
  iVar1 = Vec_IntEntry(p_00,iObj);
  p->nObjs[iVar1] = p->nObjs[iVar1] + -1;
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    (p->vTypes).pArray[(uint)iObj] = Type;
    iVar1 = Vec_IntEntry(p_00,iObj);
    p->nObjs[iVar1] = p->nObjs[iVar1] + 1;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Wln_ObjUpdateType( Wln_Ntk_t * p, int iObj, int Type )
{
    assert( Wln_ObjIsNone(p, iObj) );
    p->nObjs[Wln_ObjType(p, iObj)]--;
    Vec_IntWriteEntry( &p->vTypes, iObj, Type );
    p->nObjs[Wln_ObjType(p, iObj)]++;
}